

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator
          (SimpleParallelSimulationDataGenerator *this)

{
  pointer puVar1;
  pointer ppSVar2;
  
  puVar1 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  ppSVar2 = (this->mData).
            super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2);
  }
  SimulationChannelDescriptorGroup::~SimulationChannelDescriptorGroup(&this->mSimulationData);
  return;
}

Assistant:

SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator()
{
}